

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::ListColumnWriter::InitializeWriteState(ListColumnWriter *this,RowGroup *row_group)

{
  pointer pCVar1;
  pointer pCVar2;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> _Var4;
  pointer pCVar5;
  pointer pLVar6;
  RowGroup *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> local_38;
  _Head_base<0UL,_duckdb::ListColumnWriterState_*,_false> local_30;
  
  pCVar1 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_30._M_head_impl = (ListColumnWriterState *)operator_new(0x90);
  ((local_30._M_head_impl)->super_ColumnWriterState).is_empty.
  super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).is_empty.
  super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((local_30._M_head_impl)->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&((local_30._M_head_impl)->super_ColumnWriterState).repetition_levels.
           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&((local_30._M_head_impl)->super_ColumnWriterState).is_empty.
           super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  ((local_30._M_head_impl)->super_ColumnWriterState).is_empty.
  super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  ((local_30._M_head_impl)->super_ColumnWriterState).parent_null_count = 0;
  ((local_30._M_head_impl)->super_ColumnWriterState).null_count = 0;
  ((local_30._M_head_impl)->super_ColumnWriterState)._vptr_ColumnWriterState =
       (_func_int **)&PTR__ListColumnWriterState_004a0118;
  (local_30._M_head_impl)->row_group = in_RDX;
  (local_30._M_head_impl)->col_idx = ((long)pCVar1 - (long)pCVar2 >> 7) * -0x3333333333333333;
  ((local_30._M_head_impl)->child_state).
  super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false> =
       (_Head_base<0UL,_duckdb::ColumnWriterState_*,_false>)0x0;
  (local_30._M_head_impl)->parent_index = 0;
  pCVar5 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
           operator->((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                       *)&(row_group->sorting_columns).
                          super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                          .
                          super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  (*pCVar5->_vptr_ColumnWriter[2])(&local_38,pCVar5);
  pLVar6 = unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
           ::operator->((unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
                         *)&local_30);
  _Var4._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ColumnWriterState *)0x0;
  _Var3._M_head_impl =
       (pLVar6->child_state).
       super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
       .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
  (pLVar6->child_state).
  super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (ColumnWriterState *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ColumnWriterState + 8))();
    if (local_38._M_head_impl != (ColumnWriterState *)0x0) {
      (*(local_38._M_head_impl)->_vptr_ColumnWriterState[1])();
    }
  }
  (this->super_ColumnWriter)._vptr_ColumnWriter = (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         this;
}

Assistant:

unique_ptr<ColumnWriterState> ListColumnWriter::InitializeWriteState(duckdb_parquet::RowGroup &row_group) {
	auto result = make_uniq<ListColumnWriterState>(row_group, row_group.columns.size());
	result->child_state = child_writer->InitializeWriteState(row_group);
	return std::move(result);
}